

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O3

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::create_page(LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  progress_guarantee i_progress_guarantee_00;
  uintptr_t uint_pointer;
  ControlBlock *pCVar1;
  undefined8 *puVar2;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    pCVar1 = (ControlBlock *)
             density_tests::DeepTestAllocator<65536UL>::allocate_page_zeroed
                       ((DeepTestAllocator<65536UL> *)this);
    if (pCVar1 == (ControlBlock *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::__throw_system_error;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else {
    i_progress_guarantee_00 = i_progress_guarantee == LfQueue_LockFree ^ progress_wait_free;
    if (i_progress_guarantee == LfQueue_Blocking) {
      i_progress_guarantee_00 = progress_blocking;
    }
    pCVar1 = (ControlBlock *)
             density_tests::DeepTestAllocator<65536UL>::try_allocate_page_zeroed
                       ((DeepTestAllocator<65536UL> *)this,i_progress_guarantee_00);
    if (pCVar1 == (ControlBlock *)0x0) {
      return (ControlBlock *)0x0;
    }
  }
  LOCK();
  *(undefined8 *)(((ulong)pCVar1 & 0xffffffffffff0000) + 0xffc0) = 8;
  UNLOCK();
  return pCVar1;
}

Assistant:

ControlBlock * create_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page_zeroed()
                    : ALLOCATOR_TYPE::try_allocate_page_zeroed(
                        ToDenGuarantee(i_progress_guarantee)));
                if (new_page != nullptr)
                {
                    ControlBlock * const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));
                }
                else
                {
                    if (i_progress_guarantee == LfQueue_Throwing)
                    {
                        throw std::bad_alloc();
                    }
                }
                return new_page;
            }